

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyValueFile.h
# Opt level: O1

bool __thiscall KeyValueFile::loadFromString(KeyValueFile *this,char *data,char *debug_file_name)

{
  char cVar1;
  char cVar2;
  PrintErrorFunc p_Var3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  undefined8 *puVar12;
  long *plVar13;
  int iVar14;
  ulong uVar15;
  size_type *psVar16;
  ulong *puVar17;
  ulong uVar18;
  undefined7 uVar20;
  ulong uVar19;
  char *pcVar21;
  uint uVar22;
  undefined8 unaff_RBP;
  ulong uVar23;
  ulong *puVar24;
  PrintErrorFunc p_Var25;
  _Alloc_hider *p_Var26;
  uint uVar27;
  byte bVar28;
  bool bVar29;
  string __str;
  StringKeyValue x;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8;
  long lStack_1e0;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8 [2];
  long *local_1b8;
  undefined8 local_1b0;
  long local_1a8;
  undefined8 uStack_1a0;
  ulong local_198;
  string local_190;
  KeyValueFile *local_170;
  char *local_168;
  ulong *local_160;
  long local_158;
  ulong local_150;
  long lStack_148;
  ulong local_140;
  long *local_138 [2];
  long local_128 [2];
  ulong local_118;
  uint local_10c;
  undefined8 local_108;
  ulong local_100;
  uint local_f4;
  PrintErrorFunc local_f0;
  int local_e4;
  undefined1 local_e0 [32];
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  ulong local_a0;
  string local_98;
  string local_78;
  vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_> *local_58;
  char *local_50;
  PrintErrorFunc local_48;
  size_t local_40;
  ulong local_38;
  
  pcVar21 = (char *)(this->fileName)._M_string_length;
  local_170 = this;
  strlen(debug_file_name);
  bVar28 = 0;
  std::__cxx11::string::_M_replace((ulong)&this->fileName,0,pcVar21,(ulong)debug_file_name);
  if (data != (char *)0x0) {
    if ((*data == -0x11) && (data[1] == -0x45)) {
      lVar9 = (ulong)(data[2] == -0x41) * 3;
    }
    else {
      lVar9 = 0;
    }
    pcVar21 = data + lVar9;
    sVar10 = strlen(pcVar21);
    local_e0._0_8_ = local_e0 + 0x10;
    local_e0._8_8_ = 0;
    local_e0[0x10] = '\0';
    local_c0._M_p = (pointer)&local_b0;
    local_b8 = 0;
    local_b0._M_local_buf[0] = '\0';
    uVar6 = (uint)sVar10;
    if ((int)uVar6 < 0) {
      bVar28 = 1;
    }
    else {
      local_e4 = uVar6 - 1;
      local_58 = &local_170->kv;
      local_38 = (ulong)(uVar6 & 0x7fffffff);
      uVar23 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      local_198 = 1;
      local_100 = 0;
      local_108 = 0;
      local_118 = 0;
      uVar18 = 0;
      uVar15 = 0;
      local_168 = pcVar21;
      local_50 = debug_file_name;
      local_40 = sVar10;
      do {
        local_f4 = (uint)uVar23;
        iVar14 = (int)uVar15;
        uVar11 = (ulong)iVar14;
        bVar28 = pcVar21[uVar11];
        local_140 = uVar15;
        if (bVar28 == 0x5c) {
          if (iVar14 == local_e4) {
            local_140 = (ulong)(iVar14 + 1);
          }
          else {
            bVar29 = false;
            bVar5 = false;
            local_a0 = uVar18;
            do {
              uVar23 = uVar11 + 1;
              if ((long)local_38 <= (long)uVar23) break;
              cVar1 = local_168[uVar23];
              uVar20 = (undefined7)((ulong)local_168 >> 8);
              pcVar21 = local_168;
              if (cVar1 == ';') {
                cVar2 = local_168[uVar11];
                pcVar21 = (char *)CONCAT71(uVar20,cVar2);
                if (cVar2 == '\t') {
                  bVar29 = true;
                }
                bVar5 = bVar29;
                if (cVar2 == ' ') {
                  bVar5 = true;
                  bVar29 = true;
                }
              }
              if ((' ' < cVar1) && (!bVar5)) break;
              if (cVar1 == '\n') {
                local_198 = (ulong)((int)local_198 + 1);
                local_140 = (ulong)((int)uVar11 + 2);
                uVar19 = CONCAT71((int7)((ulong)pcVar21 >> 8),1);
              }
              else if ((cVar1 == '\r') && (local_168[uVar11 + 2] == '\n')) {
                local_198 = (ulong)((int)local_198 + 1);
                local_140 = (ulong)((int)uVar15 + 3);
                uVar19 = CONCAT71(uVar20,1);
              }
              else {
                uVar19 = 0;
              }
              if ((char)uVar19 != '\0') {
                if (((uVar18 & 1) != 0) &&
                   (p_Var25 = local_170->printErrorFunc, p_Var25 != (PrintErrorFunc)0x0)) {
                  local_10c = (uint)uVar19;
                  local_138[0] = local_128;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_138,
                             "ERROR: Line concatenation inside comment. At file \'","");
                  plVar13 = (long *)std::__cxx11::string::_M_append
                                              ((char *)local_138,
                                               (ulong)(local_170->fileName)._M_dataplus._M_p);
                  puVar24 = (ulong *)(plVar13 + 2);
                  if ((ulong *)*plVar13 == puVar24) {
                    local_150 = *puVar24;
                    lStack_148 = plVar13[3];
                    local_160 = &local_150;
                  }
                  else {
                    local_150 = *puVar24;
                    local_160 = (ulong *)*plVar13;
                  }
                  local_158 = plVar13[1];
                  *plVar13 = (long)puVar24;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_160);
                  puVar24 = (ulong *)(plVar13 + 2);
                  if ((ulong *)*plVar13 == puVar24) {
                    local_1e8 = *puVar24;
                    lStack_1e0 = plVar13[3];
                    local_1f8 = &local_1e8;
                  }
                  else {
                    local_1e8 = *puVar24;
                    local_1f8 = (ulong *)*plVar13;
                  }
                  local_1f0 = plVar13[1];
                  *plVar13 = (long)puVar24;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  uVar27 = (int)local_198 - 1;
                  uVar6 = -uVar27;
                  if (0 < (int)uVar27) {
                    uVar6 = uVar27;
                  }
                  uVar22 = 1;
                  if (9 < uVar6) {
                    uVar18 = (ulong)uVar6;
                    uVar4 = 4;
                    do {
                      uVar22 = uVar4;
                      uVar7 = (uint)uVar18;
                      if (uVar7 < 100) {
                        uVar22 = uVar22 - 2;
                        goto LAB_00127ec0;
                      }
                      if (uVar7 < 1000) {
                        uVar22 = uVar22 - 1;
                        goto LAB_00127ec0;
                      }
                      if (uVar7 < 10000) goto LAB_00127ec0;
                      uVar18 = uVar18 / 10000;
                      uVar4 = uVar22 + 4;
                    } while (99999 < uVar7);
                    uVar22 = uVar22 + 1;
                  }
LAB_00127ec0:
                  local_1d8 = local_1c8;
                  local_f0 = p_Var25;
                  std::__cxx11::string::_M_construct
                            ((ulong)&local_1d8,(char)uVar22 - (char)((int)uVar27 >> 0x1f));
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            ((char *)((ulong)(uVar27 >> 0x1f) + (long)local_1d8),uVar22,uVar6);
                  uVar18 = local_a0;
                  p_Var25 = local_f0;
                  uVar11 = 0xf;
                  if (local_1f8 != &local_1e8) {
                    uVar11 = local_1e8;
                  }
                  if (uVar11 < (ulong)(local_1d0 + local_1f0)) {
                    uVar11 = 0xf;
                    if (local_1d8 != local_1c8) {
                      uVar11 = local_1c8[0];
                    }
                    if (uVar11 < (ulong)(local_1d0 + local_1f0)) goto LAB_00127f51;
                    puVar12 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_1f8);
                  }
                  else {
LAB_00127f51:
                    puVar12 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_1d8);
                  }
                  local_1b8 = &local_1a8;
                  plVar13 = puVar12 + 2;
                  if ((long *)*puVar12 == plVar13) {
                    local_1a8 = *plVar13;
                    uStack_1a0 = puVar12[3];
                  }
                  else {
                    local_1a8 = *plVar13;
                    local_1b8 = (long *)*puVar12;
                  }
                  local_1b0 = puVar12[1];
                  *puVar12 = plVar13;
                  puVar12[1] = 0;
                  *(undefined1 *)plVar13 = 0;
                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1b8);
                  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                  psVar16 = (size_type *)(plVar13 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar13 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar16) {
                    local_190.field_2._M_allocated_capacity = *psVar16;
                    local_190.field_2._8_4_ = (undefined4)plVar13[3];
                    local_190.field_2._12_4_ = *(undefined4 *)((long)plVar13 + 0x1c);
                  }
                  else {
                    local_190.field_2._M_allocated_capacity = *psVar16;
                    local_190._M_dataplus._M_p = (pointer)*plVar13;
                  }
                  local_190._M_string_length = plVar13[1];
                  *plVar13 = (long)psVar16;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  (*p_Var25)(local_190._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_190._M_dataplus._M_p != &local_190.field_2) {
                    operator_delete(local_190._M_dataplus._M_p,
                                    local_190.field_2._M_allocated_capacity + 1);
                  }
                  if (local_1b8 != &local_1a8) {
                    operator_delete(local_1b8,local_1a8 + 1);
                  }
                  if (local_1d8 != local_1c8) {
                    operator_delete(local_1d8,local_1c8[0] + 1);
                  }
                  if (local_1f8 != &local_1e8) {
                    operator_delete(local_1f8,local_1e8 + 1);
                  }
                  if (local_160 != &local_150) {
                    operator_delete(local_160,local_150 + 1);
                  }
                  if (local_138[0] != local_128) {
                    operator_delete(local_138[0],local_128[0] + 1);
                  }
                  uVar19 = (ulong)local_10c;
                }
                p_Var25 = (PrintErrorFunc)(long)(int)local_140;
                if ((local_168[(long)p_Var25] != ';' && ' ' < local_168[(long)p_Var25]) &&
                   (p_Var3 = local_170->printErrorFunc, p_Var3 != (PrintErrorFunc)0x0)) {
                  local_10c = (uint)uVar19;
                  local_138[0] = local_128;
                  local_f0 = p_Var25;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_138,
                             "ERROR: The next line after the line concatenation symbol \'\\\' must be started with space. At file \'"
                             ,"");
                  plVar13 = (long *)std::__cxx11::string::_M_append
                                              ((char *)local_138,
                                               (ulong)(local_170->fileName)._M_dataplus._M_p);
                  puVar24 = (ulong *)(plVar13 + 2);
                  if ((ulong *)*plVar13 == puVar24) {
                    local_150 = *puVar24;
                    lStack_148 = plVar13[3];
                    local_160 = &local_150;
                  }
                  else {
                    local_150 = *puVar24;
                    local_160 = (ulong *)*plVar13;
                  }
                  local_158 = plVar13[1];
                  *plVar13 = (long)puVar24;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_160);
                  puVar24 = (ulong *)(plVar13 + 2);
                  if ((ulong *)*plVar13 == puVar24) {
                    local_1e8 = *puVar24;
                    lStack_1e0 = plVar13[3];
                    local_1f8 = &local_1e8;
                  }
                  else {
                    local_1e8 = *puVar24;
                    local_1f8 = (ulong *)*plVar13;
                  }
                  local_1f0 = plVar13[1];
                  *plVar13 = (long)puVar24;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  uVar27 = (uint)local_198;
                  uVar6 = -uVar27;
                  if (0 < (int)uVar27) {
                    uVar6 = uVar27;
                  }
                  uVar22 = 1;
                  if (9 < uVar6) {
                    uVar18 = (ulong)uVar6;
                    uVar4 = 4;
                    do {
                      uVar22 = uVar4;
                      uVar7 = (uint)uVar18;
                      if (uVar7 < 100) {
                        uVar22 = uVar22 - 2;
                        goto LAB_00128267;
                      }
                      if (uVar7 < 1000) {
                        uVar22 = uVar22 - 1;
                        goto LAB_00128267;
                      }
                      if (uVar7 < 10000) goto LAB_00128267;
                      uVar18 = uVar18 / 10000;
                      uVar4 = uVar22 + 4;
                    } while (99999 < uVar7);
                    uVar22 = uVar22 + 1;
                  }
LAB_00128267:
                  local_1d8 = local_1c8;
                  local_48 = p_Var3;
                  std::__cxx11::string::_M_construct
                            ((ulong)&local_1d8,(char)-((int)uVar27 >> 0x1f) + (char)uVar22);
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            ((char *)((ulong)(uint)-((int)uVar27 >> 0x1f) + (long)local_1d8),uVar22,
                             uVar6);
                  p_Var25 = local_48;
                  uVar18 = local_a0;
                  uVar11 = 0xf;
                  if (local_1f8 != &local_1e8) {
                    uVar11 = local_1e8;
                  }
                  if (uVar11 < (ulong)(local_1d0 + local_1f0)) {
                    uVar11 = 0xf;
                    if (local_1d8 != local_1c8) {
                      uVar11 = local_1c8[0];
                    }
                    if (uVar11 < (ulong)(local_1d0 + local_1f0)) goto LAB_001282fd;
                    puVar12 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_1f8);
                  }
                  else {
LAB_001282fd:
                    puVar12 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_1d8);
                  }
                  local_1b8 = &local_1a8;
                  plVar13 = puVar12 + 2;
                  if ((long *)*puVar12 == plVar13) {
                    local_1a8 = *plVar13;
                    uStack_1a0 = puVar12[3];
                  }
                  else {
                    local_1a8 = *plVar13;
                    local_1b8 = (long *)*puVar12;
                  }
                  local_1b0 = puVar12[1];
                  *puVar12 = plVar13;
                  puVar12[1] = 0;
                  *(undefined1 *)plVar13 = 0;
                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1b8);
                  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                  psVar16 = (size_type *)(plVar13 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar13 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar16) {
                    local_190.field_2._M_allocated_capacity = *psVar16;
                    local_190.field_2._8_4_ = (undefined4)plVar13[3];
                    local_190.field_2._12_4_ = *(undefined4 *)((long)plVar13 + 0x1c);
                  }
                  else {
                    local_190.field_2._M_allocated_capacity = *psVar16;
                    local_190._M_dataplus._M_p = (pointer)*plVar13;
                  }
                  local_190._M_string_length = plVar13[1];
                  *plVar13 = (long)psVar16;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  (*p_Var25)(local_190._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_190._M_dataplus._M_p != &local_190.field_2) {
                    operator_delete(local_190._M_dataplus._M_p,
                                    local_190.field_2._M_allocated_capacity + 1);
                  }
                  if (local_1b8 != &local_1a8) {
                    operator_delete(local_1b8,local_1a8 + 1);
                  }
                  if (local_1d8 != local_1c8) {
                    operator_delete(local_1d8,local_1c8[0] + 1);
                  }
                  if (local_1f8 != &local_1e8) {
                    operator_delete(local_1f8,local_1e8 + 1);
                  }
                  if (local_160 != &local_150) {
                    operator_delete(local_160,local_150 + 1);
                  }
                  if (local_138[0] != local_128) {
                    operator_delete(local_138[0],local_128[0] + 1);
                  }
                  uVar19 = (ulong)local_10c;
                  p_Var25 = local_f0;
                }
                bVar28 = local_168[(long)p_Var25];
              }
              uVar15 = (ulong)((int)uVar15 + 1);
              uVar11 = uVar23;
            } while ((char)uVar19 == '\0');
          }
        }
        puVar24 = &local_150;
        if (bVar28 < 0xe) {
          uVar11 = 0;
          if ((0x2401U >> (bVar28 & 0x1f) & 1) == 0) goto LAB_001284a1;
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_78,local_e0._0_8_,(pointer)(local_e0._0_8_ + local_e0._8_8_));
          trimStr(&local_190,local_170,&local_78);
          pcVar21 = local_168;
          std::__cxx11::string::operator=((string *)local_e0,(string *)&local_190);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,local_c0._M_p,local_c0._M_p + local_b8);
          trimStr(&local_190,local_170,&local_98);
          std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_190);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          iVar14 = (int)local_140;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((((local_e0._8_8_ == 0) || (local_b8 == 0)) || ((local_118 & 1) == 0)) ||
             ((local_100 & 1) != 0)) {
            if (local_e0._8_8_ != 0) {
              uVar20 = (undefined7)((ulong)local_170 >> 8);
              if ((local_100 & 1) == 0) {
                if ((local_118 & 1) == 0) {
                  p_Var25 = local_170->printErrorFunc;
                  local_108 = CONCAT71(uVar20,1);
                  if (p_Var25 == (PrintErrorFunc)0x0) {
LAB_0012869e:
                    local_108 = CONCAT71(uVar20,1);
                    pcVar21 = local_168;
                    goto LAB_00128e2b;
                  }
                  local_138[0] = local_128;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_138,"ERROR: Expected \'=\' at file \'","");
                  puVar12 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      ((char *)local_138,
                                       (ulong)(local_170->fileName)._M_dataplus._M_p);
                  puVar17 = puVar12 + 2;
                  if ((ulong *)*puVar12 == puVar17) {
                    local_150 = *puVar17;
                    lStack_148 = puVar12[3];
                    local_160 = puVar24;
                  }
                  else {
                    local_150 = *puVar17;
                    local_160 = (ulong *)*puVar12;
                  }
                  local_158 = puVar12[1];
                  *puVar12 = puVar17;
                  puVar12[1] = 0;
                  *(undefined1 *)(puVar12 + 2) = 0;
                  puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
                  puVar24 = puVar12 + 2;
                  if ((ulong *)*puVar12 == puVar24) {
                    local_1e8 = *puVar24;
                    lStack_1e0 = puVar12[3];
                    local_1f8 = &local_1e8;
                  }
                  else {
                    local_1e8 = *puVar24;
                    local_1f8 = (ulong *)*puVar12;
                  }
                  local_1f0 = puVar12[1];
                  *puVar12 = puVar24;
                  puVar12[1] = 0;
                  *(undefined1 *)(puVar12 + 2) = 0;
                  uVar27 = (uint)local_198;
                  uVar6 = -uVar27;
                  if (0 < (int)uVar27) {
                    uVar6 = uVar27;
                  }
                  uVar22 = 1;
                  if (9 < uVar6) {
                    uVar18 = (ulong)uVar6;
                    uVar4 = 4;
                    do {
                      uVar22 = uVar4;
                      uVar7 = (uint)uVar18;
                      if (uVar7 < 100) {
                        uVar22 = uVar22 - 2;
                        goto LAB_00128ad0;
                      }
                      if (uVar7 < 1000) {
                        uVar22 = uVar22 - 1;
                        goto LAB_00128ad0;
                      }
                      if (uVar7 < 10000) goto LAB_00128ad0;
                      uVar18 = uVar18 / 10000;
                      uVar4 = uVar22 + 4;
                    } while (99999 < uVar7);
                    uVar22 = uVar22 + 1;
                  }
LAB_00128ad0:
                  local_1d8 = local_1c8;
                  std::__cxx11::string::_M_construct
                            ((ulong)&local_1d8,(char)-((int)uVar27 >> 0x1f) + (char)uVar22);
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            ((char *)((ulong)(uint)-((int)uVar27 >> 0x1f) + (long)local_1d8),uVar22,
                             uVar6);
                  uVar18 = 0xf;
                  if (local_1f8 != &local_1e8) {
                    uVar18 = local_1e8;
                  }
                  if (uVar18 < (ulong)(local_1d0 + local_1f0)) {
                    uVar18 = 0xf;
                    if (local_1d8 != local_1c8) {
                      uVar18 = local_1c8[0];
                    }
                    if (uVar18 < (ulong)(local_1d0 + local_1f0)) goto LAB_00128b60;
                    puVar12 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_1f8);
                  }
                  else {
LAB_00128b60:
                    puVar12 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_1d8);
                  }
                  plVar13 = puVar12 + 2;
                  if ((long *)*puVar12 == plVar13) {
                    local_1a8 = *plVar13;
                    uStack_1a0 = puVar12[3];
                    local_1b8 = &local_1a8;
                  }
                  else {
                    local_1a8 = *plVar13;
                    local_1b8 = (long *)*puVar12;
                  }
                  local_1b0 = puVar12[1];
                  *puVar12 = plVar13;
                  puVar12[1] = 0;
                  *(undefined1 *)plVar13 = 0;
                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1b8);
                  psVar16 = (size_type *)(plVar13 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar13 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar16) {
                    local_190.field_2._M_allocated_capacity = *psVar16;
                    local_190.field_2._8_4_ = (undefined4)plVar13[3];
                    local_190.field_2._12_4_ = *(undefined4 *)((long)plVar13 + 0x1c);
                    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                  }
                  else {
                    local_190.field_2._M_allocated_capacity = *psVar16;
                    local_190._M_dataplus._M_p = (pointer)*plVar13;
                  }
                  local_190._M_string_length = plVar13[1];
                  *plVar13 = (long)psVar16;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  (*p_Var25)(local_190._M_dataplus._M_p);
                }
                else {
                  if (local_b8 != 0) goto LAB_00128e2b;
                  p_Var25 = local_170->printErrorFunc;
                  local_108 = CONCAT71(uVar20,1);
                  if (p_Var25 == (PrintErrorFunc)0x0) goto LAB_0012869e;
                  local_138[0] = local_128;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_138,"ERROR: Expected value after \'=\' at file \'","");
                  plVar13 = (long *)std::__cxx11::string::_M_append
                                              ((char *)local_138,
                                               (ulong)(local_170->fileName)._M_dataplus._M_p);
                  puVar17 = (ulong *)(plVar13 + 2);
                  if ((ulong *)*plVar13 == puVar17) {
                    local_150 = *puVar17;
                    lStack_148 = plVar13[3];
                    local_160 = puVar24;
                  }
                  else {
                    local_150 = *puVar17;
                    local_160 = (ulong *)*plVar13;
                  }
                  local_158 = plVar13[1];
                  *plVar13 = (long)puVar17;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
                  puVar24 = puVar12 + 2;
                  if ((ulong *)*puVar12 == puVar24) {
                    local_1e8 = *puVar24;
                    lStack_1e0 = puVar12[3];
                    local_1f8 = &local_1e8;
                  }
                  else {
                    local_1e8 = *puVar24;
                    local_1f8 = (ulong *)*puVar12;
                  }
                  local_1f0 = puVar12[1];
                  *puVar12 = puVar24;
                  puVar12[1] = 0;
                  *(undefined1 *)(puVar12 + 2) = 0;
                  uVar27 = (uint)local_198;
                  uVar6 = -uVar27;
                  if (0 < (int)uVar27) {
                    uVar6 = uVar27;
                  }
                  uVar22 = 1;
                  if (9 < uVar6) {
                    uVar18 = (ulong)uVar6;
                    uVar4 = 4;
                    do {
                      uVar22 = uVar4;
                      uVar7 = (uint)uVar18;
                      if (uVar7 < 100) {
                        uVar22 = uVar22 - 2;
                        goto LAB_00128c28;
                      }
                      if (uVar7 < 1000) {
                        uVar22 = uVar22 - 1;
                        goto LAB_00128c28;
                      }
                      if (uVar7 < 10000) goto LAB_00128c28;
                      uVar18 = uVar18 / 10000;
                      uVar4 = uVar22 + 4;
                    } while (99999 < uVar7);
                    uVar22 = uVar22 + 1;
                  }
LAB_00128c28:
                  local_1d8 = local_1c8;
                  std::__cxx11::string::_M_construct
                            ((ulong)&local_1d8,(char)-((int)uVar27 >> 0x1f) + (char)uVar22);
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            ((char *)((ulong)(uint)-((int)uVar27 >> 0x1f) + (long)local_1d8),uVar22,
                             uVar6);
                  uVar18 = 0xf;
                  if (local_1f8 != &local_1e8) {
                    uVar18 = local_1e8;
                  }
                  if (uVar18 < (ulong)(local_1d0 + local_1f0)) {
                    uVar18 = 0xf;
                    if (local_1d8 != local_1c8) {
                      uVar18 = local_1c8[0];
                    }
                    if (uVar18 < (ulong)(local_1d0 + local_1f0)) goto LAB_00128cb8;
                    puVar12 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_1f8);
                  }
                  else {
LAB_00128cb8:
                    puVar12 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_1d8);
                  }
                  plVar13 = puVar12 + 2;
                  if ((long *)*puVar12 == plVar13) {
                    local_1a8 = *plVar13;
                    uStack_1a0 = puVar12[3];
                    local_1b8 = &local_1a8;
                  }
                  else {
                    local_1a8 = *plVar13;
                    local_1b8 = (long *)*puVar12;
                  }
                  local_1b0 = puVar12[1];
                  *puVar12 = plVar13;
                  puVar12[1] = 0;
                  *(undefined1 *)plVar13 = 0;
                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1b8);
                  psVar16 = (size_type *)(plVar13 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar13 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar16) {
                    local_190.field_2._M_allocated_capacity = *psVar16;
                    local_190.field_2._8_4_ = (undefined4)plVar13[3];
                    local_190.field_2._12_4_ = *(undefined4 *)((long)plVar13 + 0x1c);
                    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                  }
                  else {
                    local_190.field_2._M_allocated_capacity = *psVar16;
                    local_190._M_dataplus._M_p = (pointer)*plVar13;
                  }
                  local_190._M_string_length = plVar13[1];
                  *plVar13 = (long)psVar16;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  (*p_Var25)(local_190._M_dataplus._M_p);
                }
              }
              else {
                if ((local_50 != (char *)0x0) && (*local_50 != '\0')) {
                  bVar5 = includeFile(local_170,local_c0._M_p,local_170->includeDepth);
                  local_108 = CONCAT71((int7)((ulong)local_108 >> 8),(byte)local_108 | !bVar5);
                  goto LAB_00128e2b;
                }
                p_Var25 = local_170->printErrorFunc;
                local_108 = CONCAT71(uVar20,1);
                if (p_Var25 == (PrintErrorFunc)0x0) goto LAB_0012869e;
                local_138[0] = local_128;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_138,
                           "ERROR: File name must be passed to loadFromString() when you are using \'include\'. At file \'"
                           ,"");
                puVar12 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)local_138,(ulong)(local_170->fileName)._M_dataplus._M_p
                                    );
                puVar17 = puVar12 + 2;
                if ((ulong *)*puVar12 == puVar17) {
                  local_150 = *puVar17;
                  lStack_148 = puVar12[3];
                  local_160 = puVar24;
                }
                else {
                  local_150 = *puVar17;
                  local_160 = (ulong *)*puVar12;
                }
                local_158 = puVar12[1];
                *puVar12 = puVar17;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                plVar13 = (long *)std::__cxx11::string::append((char *)&local_160);
                puVar24 = (ulong *)(plVar13 + 2);
                if ((ulong *)*plVar13 == puVar24) {
                  local_1e8 = *puVar24;
                  lStack_1e0 = plVar13[3];
                  local_1f8 = &local_1e8;
                }
                else {
                  local_1e8 = *puVar24;
                  local_1f8 = (ulong *)*plVar13;
                }
                local_1f0 = plVar13[1];
                *plVar13 = (long)puVar24;
                plVar13[1] = 0;
                *(undefined1 *)(plVar13 + 2) = 0;
                uVar27 = (uint)local_198;
                uVar6 = -uVar27;
                if (0 < (int)uVar27) {
                  uVar6 = uVar27;
                }
                uVar22 = 1;
                if (9 < uVar6) {
                  uVar18 = (ulong)uVar6;
                  uVar4 = 4;
                  do {
                    uVar22 = uVar4;
                    uVar7 = (uint)uVar18;
                    if (uVar7 < 100) {
                      uVar22 = uVar22 - 2;
                      goto LAB_00128894;
                    }
                    if (uVar7 < 1000) {
                      uVar22 = uVar22 - 1;
                      goto LAB_00128894;
                    }
                    if (uVar7 < 10000) goto LAB_00128894;
                    uVar18 = uVar18 / 10000;
                    uVar4 = uVar22 + 4;
                  } while (99999 < uVar7);
                  uVar22 = uVar22 + 1;
                }
LAB_00128894:
                local_1d8 = local_1c8;
                std::__cxx11::string::_M_construct
                          ((ulong)&local_1d8,(char)-((int)uVar27 >> 0x1f) + (char)uVar22);
                std::__detail::__to_chars_10_impl<unsigned_int>
                          ((char *)((ulong)(uint)-((int)uVar27 >> 0x1f) + (long)local_1d8),uVar22,
                           uVar6);
                uVar18 = 0xf;
                if (local_1f8 != &local_1e8) {
                  uVar18 = local_1e8;
                }
                if (uVar18 < (ulong)(local_1d0 + local_1f0)) {
                  uVar18 = 0xf;
                  if (local_1d8 != local_1c8) {
                    uVar18 = local_1c8[0];
                  }
                  if (uVar18 < (ulong)(local_1d0 + local_1f0)) goto LAB_00128924;
                  puVar12 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_1f8);
                }
                else {
LAB_00128924:
                  puVar12 = (undefined8 *)
                            std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_1d8);
                }
                plVar13 = puVar12 + 2;
                if ((long *)*puVar12 == plVar13) {
                  local_1a8 = *plVar13;
                  uStack_1a0 = puVar12[3];
                  local_1b8 = &local_1a8;
                }
                else {
                  local_1a8 = *plVar13;
                  local_1b8 = (long *)*puVar12;
                }
                local_1b0 = puVar12[1];
                *puVar12 = plVar13;
                puVar12[1] = 0;
                *(undefined1 *)plVar13 = 0;
                plVar13 = (long *)std::__cxx11::string::append((char *)&local_1b8);
                psVar16 = (size_type *)(plVar13 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar13 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar16) {
                  local_190.field_2._M_allocated_capacity = *psVar16;
                  local_190.field_2._8_4_ = (undefined4)plVar13[3];
                  local_190.field_2._12_4_ = *(undefined4 *)((long)plVar13 + 0x1c);
                  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                }
                else {
                  local_190.field_2._M_allocated_capacity = *psVar16;
                  local_190._M_dataplus._M_p = (pointer)*plVar13;
                }
                local_190._M_string_length = plVar13[1];
                *plVar13 = (long)psVar16;
                plVar13[1] = 0;
                *(undefined1 *)(plVar13 + 2) = 0;
                (*p_Var25)(local_190._M_dataplus._M_p);
              }
              pcVar21 = local_168;
              puVar24 = &local_1e8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != &local_190.field_2) {
                operator_delete(local_190._M_dataplus._M_p,
                                local_190.field_2._M_allocated_capacity + 1);
              }
              iVar14 = (int)local_140;
              if (local_1b8 != &local_1a8) {
                operator_delete(local_1b8,local_1a8 + 1);
              }
              if (local_1d8 != local_1c8) {
                operator_delete(local_1d8,local_1c8[0] + 1);
              }
              if (local_1f8 != &local_1e8) {
                operator_delete(local_1f8,local_1e8 + 1);
              }
              if (local_160 != &local_150) {
                operator_delete(local_160,local_150 + 1);
              }
              if (local_138[0] != local_128) {
                operator_delete(local_138[0],local_128[0] + 1);
              }
            }
          }
          else {
            std::vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>
            ::push_back(local_58,(value_type *)local_e0);
          }
LAB_00128e2b:
          uVar11 = 0;
          uVar18 = 0;
          local_e0._8_8_ = 0;
          *(char *)local_e0._0_8_ = '\0';
          local_b8 = 0;
          *local_c0._M_p = '\0';
          local_198 = (ulong)((int)local_198 + (uint)(bVar28 == 10));
          uVar23 = CONCAT71((int7)((ulong)puVar24 >> 8),1);
          local_118 = 0;
          local_100 = 0;
        }
        else {
LAB_001284a1:
          iVar14 = (int)local_140;
          uVar23 = (ulong)local_f4;
          pcVar21 = local_168;
        }
        if ((bVar28 == 0x3b) &&
           ((iVar14 == 0 ||
            ((uVar11 = (ulong)(byte)pcVar21[(long)iVar14 + -1], uVar11 < 0x21 &&
             ((0x100000600U >> (uVar11 & 0x3f) & 1) != 0)))))) {
          uVar18 = CONCAT71((int7)(uVar18 >> 8),1);
        }
        if ((uVar18 & 1) == 0) {
          if ((uVar23 & 1) == 0) {
            if ((bVar28 == 0x3d) && ((local_118 & 1) == 0)) {
              local_118 = CONCAT71((int7)(uVar11 >> 8),1);
            }
            else if ((('\x1f' < (char)bVar28) && (p_Var26 = &local_c0, (local_118 & 1) != 0)) ||
                    (p_Var26 = &local_c0, (local_100 & 1) != 0)) goto LAB_00128f71;
          }
          else {
            p_Var26 = (_Alloc_hider *)local_e0;
            if ((char)bVar28 < '!' || bVar28 == 0x3d) {
              if (local_e0._8_8_ != 0) {
                local_118 = local_118 & 0xff;
                if (bVar28 == 0x3d) {
                  local_118 = 1;
                }
                iVar8 = std::__cxx11::string::compare((char *)p_Var26);
                local_100 = local_100 & 0xff;
                if (iVar8 == 0) {
                  local_100 = 1;
                }
                uVar23 = 0;
              }
            }
            else {
LAB_00128f71:
              std::__cxx11::string::push_back((char)p_Var26);
            }
          }
        }
        uVar15 = (ulong)(iVar14 + 1);
      } while (iVar14 < (int)local_40);
      bVar28 = (byte)local_108 ^ 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_p != &local_b0) {
      operator_delete(local_c0._M_p,
                      CONCAT71(local_b0._M_allocated_capacity._1_7_,local_b0._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
      operator_delete((void *)local_e0._0_8_,CONCAT71(local_e0._17_7_,local_e0[0x10]) + 1);
    }
  }
  return (bool)(bVar28 & 1);
}

Assistant:

bool loadFromString(const char * data, const char * debug_file_name = "")
  {
    fileName = debug_file_name;

    if (!data)
      return false;

    if (isUtf8Bom(data))
      data += 3;
    int len = int(strlen(data));

    StringKeyValue x;
    bool comment = false;
    bool readKey = true;
    bool eqFound = false;
    bool error = false;
    bool include = false;
    int line = 1;

    for (int i = 0; i <= len; i++)
    {
      char c = data[i];

      if (c == '\\')
      {
        if (i == len - 1)
          i++;
        else
        {
          bool commentAfterConcat = false;
          for (int j = i + 1; j < len; j++)
          {
            if (data[j] == ';' && isSpace(data[j - 1]))
              commentAfterConcat = true;

            if (!commentAfterConcat && data[j] > ' ')
              break;

            bool concat = false;
            if (data[j] == 0x0d && data[j + 1] == 0x0a)
            {
              line++;
              i = j + 2;
              concat = true;
            }
            else if (data[j] == 0x0a)
            {
              line++;
              i = j + 1;
              concat = true;
            }

            if (concat)
            {
              if (comment)
                if (printErrorFunc)
                  printErrorFunc((std::string("ERROR: Line concatenation inside comment. At file '") +
                    fileName + "' line " + std::to_string(line - 1) + "\n").c_str());

              if (data[i] > ' ' && data[i] != ';')
                if (printErrorFunc)
                  printErrorFunc((
                    std::string("ERROR: The next line after the line concatenation symbol '\\' must be started with space. At file '") +
                    fileName + "' line " + std::to_string(line) + "\n").c_str());

              c = data[i];
              break;
            }
          }
        }
      }

      if (c == 0x0d || c == 0x0a || c == 0)
      {
        x.key = trimStr(x.key);
        x.value = trimStr(x.value);
        if (!x.key.empty() && !x.value.empty() && eqFound && !include)
        {
          //printf("%s = \"%s\"\n", x.key.c_str(), x.value.c_str());
          kv.push_back(x);
        }
        else if (!x.key.empty())
        {
          if (include)
          {
            if (!debug_file_name || !debug_file_name[0])
            {
              if (printErrorFunc)
                printErrorFunc(
                  (std::string("ERROR: File name must be passed to loadFromString() when you are using 'include'. At file '") +
                    fileName + "' line " + std::to_string(line) + "\n").c_str());
              error = true;
            }
            else
            {
              bool ok = includeFile(x.value.c_str(), includeDepth);
              error |= !ok;
            }
          }
          else if (!eqFound)
          {
            if (printErrorFunc)
              printErrorFunc(
                (std::string("ERROR: Expected '=' at file '") + fileName + "' line " + std::to_string(line) + "\n").c_str());
            error = true;
          }
          else if (x.value.empty())
          {
            if (printErrorFunc)
              printErrorFunc(
                (std::string("ERROR: Expected value after '=' at file '") + fileName + "' line " + std::to_string(line) + "\n").c_str());
            error = true;
          }
        }

        comment = false;
        readKey = true;
        eqFound = false;
        include = false;
        x.key.clear();
        x.value.clear();

        if (c == 0x0a)
          line++;
      }

      if (c == ';' && (i == 0 || isSpace(data[i - 1]) || data[i - 1] == 0x0a))
        comment = true;

      if (comment)
        continue;

      if (readKey)
      {
        if (!isSpace(c) && c > ' ' && c != '=')
          x.key += c;
        else if (!x.key.empty())
        {
          readKey = false;
          if (c == '=')
            eqFound = true;

          if (x.key == "include")
            include = true;
        }
      }
      else
      {
        if (c == '=' && !eqFound)
          eqFound = true;
        else if ((eqFound && c >= ' ') || include)
          x.value += c;
      }
    }

    return !error;
  }